

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cc
# Opt level: O1

void __thiscall Buffer::Buffer(Buffer *this)

{
  _Head_base<0UL,_Buffer::Members_*,_false> _Var1;
  
  _Var1._M_head_impl = (Members *)operator_new(0x38);
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    **)&(_Var1._M_head_impl)->str =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)((long)&(_Var1._M_head_impl)->str + 0x10);
  *(size_type *)((long)&(_Var1._M_head_impl)->str + 8) = 0;
  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    *)((long)&(_Var1._M_head_impl)->str + 0x10))->_M_local_buf[0] = '\0';
  (_Var1._M_head_impl)->own_memory = true;
  (_Var1._M_head_impl)->size = 0;
  (_Var1._M_head_impl)->buf = (uchar *)0x0;
  (this->m)._M_t.super___uniq_ptr_impl<Buffer::Members,_std::default_delete<Buffer::Members>_>._M_t.
  super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>.
  super__Head_base<0UL,_Buffer::Members_*,_false>._M_head_impl = _Var1._M_head_impl;
  return;
}

Assistant:

Buffer::Buffer() :
    m(new Members(0, nullptr, true))
{
}